

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O3

UINT8 DecompressDataBlk(UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,
                       PCM_CMP_INF *cmprInfo)

{
  short *psVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT16 UVar4;
  PCM_COMPR_TBL *pPVar5;
  UINT8 *pUVar6;
  char cVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  short sVar14;
  int iVar15;
  ulong uVar16;
  UINT8 *pUVar17;
  ulong uVar18;
  char cVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  
  if (cmprInfo->comprType == '\x01') {
    bVar11 = cmprInfo->bitsDec;
    uVar9 = bVar11 + 7 >> 3;
    if (uVar9 == 2) {
      pPVar5 = cmprInfo->comprTbl;
      if (pPVar5->valueCount != 0) {
        if (bVar11 != pPVar5->bitsDec) {
          return '\x11';
        }
        bVar2 = cmprInfo->bitsCmp;
        if (bVar2 == pPVar5->bitsCmp) {
          uVar13 = ((ulong)inLen << 4) / (ulong)bVar2;
          uVar16 = (ulong)outLen;
          if ((uint)uVar13 < outLen) {
            uVar16 = uVar13;
          }
          if ((int)uVar16 != 0) {
            pUVar6 = (pPVar5->values).d8;
            pUVar17 = outData + (uVar16 & 0xffffffff);
            uVar10 = (uint)cmprInfo->baseVal;
            uVar9 = 0;
            do {
              if (bVar2 == 0) {
                uVar13 = 0;
              }
              else {
                uVar21 = 0;
                uVar13 = 0;
                uVar16 = (ulong)bVar2;
                do {
                  uVar23 = (uint)uVar16;
                  uVar20 = 8;
                  if (uVar23 < 8) {
                    uVar20 = uVar23;
                  }
                  uVar9 = uVar9 + uVar20;
                  uVar24 = (uint)*inData << ((byte)uVar9 & 0x1f);
                  if (7 < (ushort)uVar9) {
                    inData = inData + 1;
                    uVar8 = (ushort)uVar9 - 8;
                    uVar9 = (uint)uVar8;
                    if (uVar8 == 0) {
                      uVar9 = 0;
                    }
                    else {
                      uVar24 = uVar24 | (uint)*inData << ((byte)uVar8 & 0x1f);
                    }
                  }
                  uVar13 = (ulong)((uint)uVar13 |
                                  (uVar24 >> 8 & ~(-1 << ((byte)uVar20 & 0x1f))) <<
                                  ((byte)uVar21 & 0x1f));
                  uVar21 = (uVar21 & 0xffff) + uVar20;
                  uVar20 = uVar23 - uVar20 & 0xffff;
                  uVar16 = (ulong)uVar20;
                } while (uVar20 != 0);
              }
              uVar10 = uVar10 + *(ushort *)(pUVar6 + uVar13 * 2) & (-1 << (bVar11 & 0x1f) ^ 0xffffU)
              ;
              *(short *)outData = (short)uVar10;
              outData = outData + 2;
            } while (outData < pUVar17);
            return '\0';
          }
          return '\0';
        }
        return '\x11';
      }
    }
    else {
      if (uVar9 != 1) {
        return ' ';
      }
      pPVar5 = cmprInfo->comprTbl;
      if (pPVar5->valueCount != 0) {
        if (bVar11 != pPVar5->bitsDec) {
          return '\x11';
        }
        bVar2 = cmprInfo->bitsCmp;
        if (bVar2 == pPVar5->bitsCmp) {
          uVar13 = ((ulong)inLen << 3) / (ulong)bVar2;
          uVar16 = (ulong)outLen;
          if ((uint)uVar13 < outLen) {
            uVar16 = uVar13;
          }
          if ((int)uVar16 != 0) {
            pUVar6 = (pPVar5->values).d8;
            pUVar17 = outData + (uVar16 & 0xffffffff);
            uVar10 = (uint)cmprInfo->baseVal;
            uVar9 = 0;
            do {
              if (bVar2 == 0) {
                uVar13 = 0;
              }
              else {
                uVar21 = 0;
                uVar13 = 0;
                uVar16 = (ulong)bVar2;
                do {
                  uVar23 = (uint)uVar16;
                  uVar20 = 8;
                  if (uVar23 < 8) {
                    uVar20 = uVar23;
                  }
                  uVar9 = uVar9 + uVar20;
                  uVar24 = (uint)*inData << ((byte)uVar9 & 0x1f);
                  if (7 < (ushort)uVar9) {
                    inData = inData + 1;
                    uVar8 = (ushort)uVar9 - 8;
                    uVar9 = (uint)uVar8;
                    if (uVar8 == 0) {
                      uVar9 = 0;
                    }
                    else {
                      uVar24 = uVar24 | (uint)*inData << ((byte)uVar8 & 0x1f);
                    }
                  }
                  uVar13 = (ulong)((uint)uVar13 |
                                  (uVar24 >> 8 & ~(-1 << ((byte)uVar20 & 0x1f))) <<
                                  ((byte)uVar21 & 0x1f));
                  uVar21 = (uVar21 & 0xffff) + uVar20;
                  uVar20 = uVar23 - uVar20 & 0xffff;
                  uVar16 = (ulong)uVar20;
                } while (uVar20 != 0);
                uVar13 = uVar13 & 0xffff;
              }
              uVar10 = uVar10 + pUVar6[uVar13] & ~(-1 << (bVar11 & 0x1f));
              *outData = (UINT8)uVar10;
              outData = outData + 1;
            } while (outData < pUVar17);
            return '\0';
          }
          return '\0';
        }
        return '\x11';
      }
    }
  }
  else {
    if (cmprInfo->comprType != '\0') {
      return 0x80;
    }
    bVar11 = cmprInfo->bitsDec;
    uVar9 = bVar11 + 7 >> 3;
    if (uVar9 == 2) {
      UVar3 = cmprInfo->subType;
      bVar2 = cmprInfo->bitsCmp;
      uVar13 = (ulong)bVar2;
      uVar9 = (uint)bVar2;
      if (UVar3 != '\x02') {
        UVar4 = cmprInfo->baseVal;
        uVar16 = ((ulong)inLen << 4) / uVar13;
        uVar18 = (ulong)outLen;
        if ((uint)uVar16 < outLen) {
          uVar18 = uVar16 & 0xffffffff;
        }
        psVar1 = (short *)(outData + uVar18);
        if (UVar3 == '\0') {
          if ((int)uVar18 == 0) {
            return '\0';
          }
          uVar10 = 0;
          do {
            uVar21 = 0;
            sVar14 = 0;
            if (bVar2 != 0) {
              uVar20 = 0;
              do {
                uVar23 = 8;
                if ((ushort)uVar13 < 8) {
                  uVar23 = (uint)uVar13;
                }
                uVar10 = uVar10 + uVar23;
                uVar24 = (uint)*inData << ((byte)uVar10 & 0x1f);
                if (7 < (ushort)uVar10) {
                  inData = inData + 1;
                  uVar8 = (ushort)uVar10 - 8;
                  uVar10 = (uint)uVar8;
                  if (uVar8 == 0) {
                    uVar10 = 0;
                  }
                  else {
                    uVar24 = uVar24 | (uint)*inData << ((byte)uVar8 & 0x1f);
                  }
                }
                uVar22 = (uint)uVar13 - uVar23;
                uVar13 = (ulong)uVar22;
                bVar11 = (byte)uVar21;
                uVar21 = (uVar21 & 0xffff) + (uVar23 & 0xffff);
                uVar20 = uVar20 | (~(-1 << ((byte)uVar23 & 0x1f)) & 0xffffU & uVar24 >> 8) <<
                                  (bVar11 & 0x1f);
                sVar14 = (short)uVar20;
              } while ((short)uVar22 != 0);
              uVar13 = (ulong)uVar9;
            }
            *(UINT16 *)outData = sVar14 + UVar4;
            outData = (UINT8 *)((long)outData + 2);
          } while (outData < psVar1);
          return '\0';
        }
        if (UVar3 != '\x01') {
          return '\0';
        }
        if ((int)uVar18 == 0) {
          return '\0';
        }
        uVar10 = 0;
        do {
          if (bVar2 == 0) {
            uVar21 = 0;
          }
          else {
            uVar20 = 0;
            uVar21 = 0;
            do {
              uVar23 = 8;
              if ((ushort)uVar13 < 8) {
                uVar23 = (uint)uVar13;
              }
              uVar10 = uVar10 + uVar23;
              uVar24 = (uint)*inData << ((byte)uVar10 & 0x1f);
              if (7 < (ushort)uVar10) {
                inData = inData + 1;
                uVar8 = (ushort)uVar10 - 8;
                uVar10 = (uint)uVar8;
                if (uVar8 == 0) {
                  uVar10 = 0;
                }
                else {
                  uVar24 = uVar24 | (uint)*inData << ((byte)uVar8 & 0x1f);
                }
              }
              uVar22 = (uint)uVar13 - uVar23;
              uVar13 = (ulong)uVar22;
              bVar12 = (byte)uVar20;
              uVar20 = (uVar20 & 0xffff) + (uVar23 & 0xffff);
              uVar21 = uVar21 | (~(-1 << ((byte)uVar23 & 0x1f)) & 0xffffU & uVar24 >> 8) <<
                                (bVar12 & 0x1f);
            } while ((short)uVar22 != 0);
          }
          *(UINT16 *)outData = (short)(uVar21 << (bVar11 - bVar2 & 0x1f)) + UVar4;
          outData = (UINT8 *)((long)outData + 2);
          uVar13 = (ulong)uVar9;
        } while (outData < psVar1);
        return '\0';
      }
      pPVar5 = cmprInfo->comprTbl;
      if (pPVar5->valueCount != 0) {
        if (bVar11 != pPVar5->bitsDec) {
          return '\x11';
        }
        if (bVar2 == pPVar5->bitsCmp) {
          uVar13 = ((ulong)inLen << 4) / uVar13;
          uVar16 = (ulong)outLen;
          if ((uint)uVar13 < outLen) {
            uVar16 = uVar13 & 0xffffffff;
          }
          if ((int)uVar16 != 0) {
            pUVar6 = (pPVar5->values).d8;
            pUVar17 = outData + uVar16;
            uVar10 = 0;
            do {
              if (bVar2 == 0) {
                uVar13 = 0;
              }
              else {
                uVar20 = 0;
                uVar13 = 0;
                uVar21 = uVar9;
                do {
                  uVar23 = 8;
                  if ((ushort)uVar21 < 8) {
                    uVar23 = uVar21;
                  }
                  uVar10 = uVar10 + uVar23;
                  uVar24 = (uint)*inData << ((byte)uVar10 & 0x1f);
                  if (7 < (ushort)uVar10) {
                    inData = inData + 1;
                    uVar8 = (ushort)uVar10 - 8;
                    uVar10 = (uint)uVar8;
                    if (uVar8 == 0) {
                      uVar10 = 0;
                    }
                    else {
                      uVar24 = uVar24 | (uint)*inData << ((byte)uVar8 & 0x1f);
                    }
                  }
                  uVar21 = uVar21 - uVar23;
                  bVar11 = (byte)uVar20;
                  uVar20 = (uVar20 & 0xffff) + (uVar23 & 0xffff);
                  uVar13 = (ulong)((uint)uVar13 |
                                  (~(-1 << ((byte)uVar23 & 0x1f)) & 0xffffU & uVar24 >> 8) <<
                                  (bVar11 & 0x1f));
                } while ((short)uVar21 != 0);
              }
              *(undefined2 *)outData = *(undefined2 *)(pUVar6 + uVar13 * 2);
              outData = outData + 2;
            } while (outData < pUVar17);
            return '\0';
          }
          return '\0';
        }
        return '\x11';
      }
    }
    else {
      if (uVar9 != 1) {
        return ' ';
      }
      bVar2 = cmprInfo->bitsCmp;
      uVar13 = (ulong)bVar2;
      UVar3 = cmprInfo->subType;
      uVar9 = (uint)bVar2;
      if (UVar3 != '\x02') {
        uVar16 = ((ulong)inLen << 3) / uVar13;
        uVar18 = (ulong)outLen;
        if ((uint)uVar16 < outLen) {
          uVar18 = uVar16;
        }
        pUVar6 = outData + (uVar18 & 0xffffffff);
        cVar7 = (char)cmprInfo->baseVal;
        if (UVar3 == '\0') {
          if ((int)uVar18 != 0) {
            uVar10 = 0;
            do {
              sVar14 = 0;
              if (bVar2 == 0) {
                cVar19 = '\0';
              }
              else {
                uVar21 = 0;
                do {
                  iVar15 = 8;
                  if ((ushort)uVar13 < 8) {
                    iVar15 = (int)uVar13;
                  }
                  uVar10 = uVar10 + iVar15;
                  uVar20 = (uint)*inData << ((byte)uVar10 & 0x1f);
                  if (7 < (ushort)uVar10) {
                    inData = inData + 1;
                    uVar8 = (ushort)uVar10 - 8;
                    uVar10 = (uint)uVar8;
                    if (uVar8 == 0) {
                      uVar10 = 0;
                    }
                    else {
                      uVar20 = uVar20 | (uint)*inData << ((byte)uVar8 & 0x1f);
                    }
                  }
                  uVar23 = (int)uVar13 - iVar15;
                  uVar13 = (ulong)uVar23;
                  bVar11 = (byte)sVar14;
                  sVar14 = sVar14 + (short)iVar15;
                  uVar21 = uVar21 | (~(-1 << ((byte)iVar15 & 0x1f)) & uVar20 >> 8) <<
                                    (bVar11 & 0x1f);
                  cVar19 = (char)uVar21;
                } while ((short)uVar23 != 0);
              }
              *outData = cVar19 + cVar7;
              outData = outData + 1;
              uVar13 = (ulong)uVar9;
            } while (outData < pUVar6);
            return '\0';
          }
        }
        else {
          if (UVar3 != '\x01') {
            return '\0';
          }
          if ((int)uVar18 != 0) {
            uVar10 = 0;
            do {
              uVar21 = 0;
              if (bVar2 != 0) {
                uVar20 = 0;
                do {
                  uVar23 = 8;
                  if ((ushort)uVar13 < 8) {
                    uVar23 = (uint)uVar13;
                  }
                  uVar10 = uVar10 + uVar23;
                  uVar24 = (uint)*inData << ((byte)uVar10 & 0x1f);
                  if (7 < (ushort)uVar10) {
                    inData = inData + 1;
                    uVar8 = (ushort)uVar10 - 8;
                    uVar10 = (uint)uVar8;
                    if (uVar8 == 0) {
                      uVar10 = 0;
                    }
                    else {
                      uVar24 = uVar24 | (uint)*inData << ((byte)uVar8 & 0x1f);
                    }
                  }
                  uVar22 = (uint)uVar13 - uVar23;
                  uVar13 = (ulong)uVar22;
                  bVar12 = (byte)uVar21;
                  uVar21 = (uVar21 & 0xffff) + (uVar23 & 0xffff);
                  uVar20 = uVar20 | (~(-1 << ((byte)uVar23 & 0x1f)) & uVar24 >> 8) <<
                                    (bVar12 & 0x1f);
                } while ((short)uVar22 != 0);
                uVar21 = uVar20 & 0xffff;
                uVar13 = (ulong)uVar9;
              }
              *outData = (char)(uVar21 << (bVar11 - bVar2 & 0x1f)) + cVar7;
              outData = outData + 1;
            } while (outData < pUVar6);
            return '\0';
          }
        }
        return '\0';
      }
      pPVar5 = cmprInfo->comprTbl;
      if (pPVar5->valueCount != 0) {
        if (bVar11 != pPVar5->bitsDec) {
          return '\x11';
        }
        if (bVar2 == pPVar5->bitsCmp) {
          uVar13 = ((ulong)inLen << 3) / uVar13;
          uVar16 = (ulong)outLen;
          if ((uint)uVar13 < outLen) {
            uVar16 = uVar13 & 0xffffffff;
          }
          if ((int)uVar16 != 0) {
            pUVar6 = (pPVar5->values).d8;
            pUVar17 = outData + uVar16;
            uVar10 = 0;
            do {
              if (bVar2 == 0) {
                uVar13 = 0;
              }
              else {
                uVar20 = 0;
                uVar13 = 0;
                uVar21 = uVar9;
                do {
                  uVar23 = 8;
                  if ((ushort)uVar21 < 8) {
                    uVar23 = uVar21;
                  }
                  uVar10 = uVar10 + uVar23;
                  uVar24 = (uint)*inData << ((byte)uVar10 & 0x1f);
                  if (7 < (ushort)uVar10) {
                    inData = inData + 1;
                    uVar8 = (ushort)uVar10 - 8;
                    uVar10 = (uint)uVar8;
                    if (uVar8 == 0) {
                      uVar10 = 0;
                    }
                    else {
                      uVar24 = uVar24 | (uint)*inData << ((byte)uVar8 & 0x1f);
                    }
                  }
                  uVar21 = uVar21 - uVar23;
                  bVar11 = (byte)uVar20;
                  uVar20 = (uVar20 & 0xffff) + (uVar23 & 0xffff);
                  uVar13 = (ulong)((uint)uVar13 |
                                  (~(-1 << ((byte)uVar23 & 0x1f)) & uVar24 >> 8) << (bVar11 & 0x1f))
                  ;
                } while ((short)uVar21 != 0);
                uVar13 = uVar13 & 0xffff;
              }
              *outData = pUVar6[uVar13];
              outData = outData + 1;
            } while (outData < pUVar17);
            return '\0';
          }
          return '\0';
        }
        return '\x11';
      }
    }
  }
  return '\x10';
}

Assistant:

UINT8 DecompressDataBlk(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmprInfo)
{
	UINT8 valSize;
	UINT8 retVal;
	
	switch(cmprInfo->comprType)
	{
	case 0x00:	// Bit Packing compression
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Decompress_BitPacking_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Decompress_BitPacking_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	case 0x01:	// Delta-PCM
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Decompress_DPCM_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Decompress_DPCM_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	default:
		return 0x80;
	}
	
	return 0x00;
}